

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O0

void protocol_SerializeUnsignedIntegerBigEndian_Serialize_8(void)

{
  long lVar1;
  char *pcVar2;
  undefined1 local_40 [8];
  BufferView buffer_view;
  string buffer;
  uchar local_9 [8];
  uint8_t v;
  
  local_9[0] = '\x15';
  std::__cxx11::string::string((string *)&buffer_view.parsed_);
  udpdiscovery::impl::BufferView::BufferView((BufferView *)local_40,(string *)&buffer_view.parsed_);
  udpdiscovery::impl::SerializeUnsignedIntegerBigEndian<unsigned_char>
            (kSerialize,local_9,(BufferView *)local_40);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 1) {
    __assert_fail("buffer.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_protocol_test.cpp"
                  ,0xc,"void protocol_SerializeUnsignedIntegerBigEndian_Serialize_8()");
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&buffer_view.parsed_);
  if (*pcVar2 == '\x15') {
    std::__cxx11::string::~string((string *)&buffer_view.parsed_);
    return;
  }
  __assert_fail("buffer[0] == 0x15",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_protocol_test.cpp"
                ,0xd,"void protocol_SerializeUnsignedIntegerBigEndian_Serialize_8()");
}

Assistant:

void protocol_SerializeUnsignedIntegerBigEndian_Serialize_8() {
  uint8_t v = 0x15;
  std::string buffer;
  udpdiscovery::impl::BufferView buffer_view(&buffer);
  udpdiscovery::impl::SerializeUnsignedIntegerBigEndian(
      udpdiscovery::impl::kSerialize, &v, &buffer_view);
  assert(buffer.size() == 1);
  assert(buffer[0] == 0x15);
}